

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O0

void __thiscall
pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunked_sequence
          (chunked_sequence<int,_2UL,_4UL,_4UL> *this)

{
  chunked_sequence<int,_2UL,_4UL,_4UL> *this_local;
  
  std::__cxx11::
  list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
  ::list(&this->chunks_);
  this->size_ = 0;
  std::__cxx11::
  list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
  ::emplace_back<>(&this->chunks_);
  return;
}

Assistant:

chunked_sequence<T, ElementsPerChunk, ActualSize, ActualAlign>::chunked_sequence () {
        // Create an initial, empty chunk. This avoids checking whether the chunk list is empty
        // in the (performance sensitive) append function.
        chunks_.emplace_back ();
    }